

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::replace_fragment_output(CompilerGLSL *this,SPIRVariable *var)

{
  size_t sVar1;
  mapped_type *this_00;
  SPIRType *pSVar2;
  CompilerError *this_01;
  char (*in_R8) [2];
  bool bVar3;
  allocator local_4d;
  uint32_t location;
  string local_48;
  
  this_00 = ::std::__detail::
            _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&(this->super_Compiler).ir.meta,&(var->super_IVariant).self);
  location = 0;
  bVar3 = true;
  if (((this_00->decoration).decoration_flags.lower & 0x40000000) != 0) {
    location = (this_00->decoration).location;
    bVar3 = location == 0;
  }
  pSVar2 = Compiler::get<spirv_cross::SPIRType>
                     (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
  sVar1 = (pSVar2->array).super_VectorView<unsigned_int>.buffer_size;
  if (sVar1 == 1) {
    ::std::__cxx11::string::assign((char *)this_00);
    if (!bVar3) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_01,
                 "Arrayed output variable used, but location is not 0. This is unimplemented in SPIRV-Cross."
                );
      goto LAB_001293bc;
    }
    if (((this->options).es != true) || (299 < (this->options).version)) goto LAB_00129375;
    ::std::__cxx11::string::string((string *)&local_48,"GL_EXT_draw_buffers",&local_4d);
    require_extension_internal(this,&local_48);
  }
  else {
    if (sVar1 != 0) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_01,
                 "Array-of-array output variable used. This cannot be implemented in legacy GLSL.");
LAB_001293bc:
      __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    join<char_const(&)[13],unsigned_int&,char_const(&)[2]>
              (&local_48,(spirv_cross *)"gl_FragData[",(char (*) [13])&location,(uint *)0x2827df,
               in_R8);
    ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
    if ((((this->options).es != true) || (299 < (this->options).version)) || (location == 0))
    goto LAB_00129375;
    ::std::__cxx11::string::string((string *)&local_48,"GL_EXT_draw_buffers",&local_4d);
    require_extension_internal(this,&local_48);
  }
  ::std::__cxx11::string::~string((string *)&local_48);
LAB_00129375:
  var->compat_builtin = true;
  return;
}

Assistant:

void CompilerGLSL::replace_fragment_output(SPIRVariable &var)
{
	auto &m = ir.meta[var.self].decoration;
	uint32_t location = 0;
	if (m.decoration_flags.get(DecorationLocation))
		location = m.location;

	// If our variable is arrayed, we must not emit the array part of this as the SPIR-V will
	// do the access chain part of this for us.
	auto &type = get<SPIRType>(var.basetype);

	if (type.array.empty())
	{
		// Redirect the write to a specific render target in legacy GLSL.
		m.alias = join("gl_FragData[", location, "]");

		if (is_legacy_es() && location != 0)
			require_extension_internal("GL_EXT_draw_buffers");
	}
	else if (type.array.size() == 1)
	{
		// If location is non-zero, we probably have to add an offset.
		// This gets really tricky since we'd have to inject an offset in the access chain.
		// FIXME: This seems like an extremely odd-ball case, so it's probably fine to leave it like this for now.
		m.alias = "gl_FragData";
		if (location != 0)
			SPIRV_CROSS_THROW("Arrayed output variable used, but location is not 0. "
			                  "This is unimplemented in SPIRV-Cross.");

		if (is_legacy_es())
			require_extension_internal("GL_EXT_draw_buffers");
	}
	else
		SPIRV_CROSS_THROW("Array-of-array output variable used. This cannot be implemented in legacy GLSL.");

	var.compat_builtin = true; // We don't want to declare this variable, but use the name as-is.
}